

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O1

size_t __thiscall GdlPass::TotalNumGlyphSubRanges(GdlPass *this)

{
  pointer ppFVar1;
  FsmMachineClass *pFVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  ppFVar1 = (this->m_vpfsmc).
            super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_vpfsmc).
                super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppFVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar6 = 0;
    sVar4 = 0;
    do {
      pFVar2 = ppFVar1[lVar6];
      lVar3 = *(long *)&(pFVar2->m_wGlyphs).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data;
      uVar7 = (long)*(pointer *)
                     ((long)&(pFVar2->m_wGlyphs).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl + 8) - lVar3 >> 1;
      lVar8 = 1;
      if (1 < uVar7) {
        uVar9 = 1;
        do {
          lVar8 = lVar8 + (ulong)(*(ushort *)(lVar3 + -2 + uVar9 * 2) + 1 <
                                 (uint)*(ushort *)(lVar3 + uVar9 * 2));
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      sVar4 = sVar4 + lVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
    return sVar4;
  }
  return 0;
}

Assistant:

size_t GdlPass::TotalNumGlyphSubRanges()
{
	size_t cRanges = 0;
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		cRanges += m_vpfsmc[i]->NumberOfRanges();

	return cRanges;
}